

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChChaseCamera::Initialize
          (ChChaseCamera *this,ChVector<double> *ptOnChassis,ChCoordsys<double> *driverCoordsys,
          double chaseDist,double chaseHeight,ChVector<double> *up,ChVector<double> *fwd)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  undefined8 in_XMM0_Qb;
  ChVector<double> v;
  ChVector<double> local_58;
  ChVector<double> local_38;
  
  if (&this->m_ptOnChassis != ptOnChassis) {
    (this->m_ptOnChassis).m_data[0] = ptOnChassis->m_data[0];
    (this->m_ptOnChassis).m_data[1] = ptOnChassis->m_data[1];
    (this->m_ptOnChassis).m_data[2] = ptOnChassis->m_data[2];
  }
  ChCoordsys<double>::operator=(&this->m_driverCsys,driverCoordsys);
  this->m_dist = chaseDist;
  this->m_height = chaseHeight;
  this->m_angle = 0.0;
  if (&this->m_up != up) {
    (this->m_up).m_data[0] = up->m_data[0];
    (this->m_up).m_data[1] = up->m_data[1];
    (this->m_up).m_data[2] = up->m_data[2];
  }
  if (&this->m_fwd != fwd) {
    (this->m_fwd).m_data[0] = fwd->m_data[0];
    (this->m_fwd).m_data[1] = fwd->m_data[1];
    (this->m_fwd).m_data[2] = fwd->m_data[2];
  }
  peVar2 = (this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar4 = (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
    auVar1 = *(undefined1 (*) [16])(this->m_ptOnChassis).m_data;
    auVar3._8_8_ = in_XMM0_Qb;
    auVar3._0_8_ = chaseDist;
    auVar3 = vsubpd_avx(auVar1,auVar3);
    local_38.m_data[1] = auVar1._8_8_ + 0.0;
    local_38.m_data[0] = auVar3._0_8_;
    local_38.m_data[2] = chaseHeight + (this->m_ptOnChassis).m_data[2];
    ChFrame<double>::TransformPointLocalToParent
              (&local_58,(ChFrame<double> *)CONCAT44(extraout_var,iVar4),&local_38);
    if (&local_58 == &this->m_loc) {
      local_58.m_data[0] = (this->m_loc).m_data[0];
      local_58.m_data[1] = (this->m_loc).m_data[1];
      local_58.m_data[2] = (this->m_loc).m_data[2];
    }
    else {
      (this->m_loc).m_data[0] = local_58.m_data[0];
      (this->m_loc).m_data[1] = local_58.m_data[1];
      (this->m_loc).m_data[2] = local_58.m_data[2];
    }
    (this->m_lastLoc).m_data[0] = local_58.m_data[0];
    (this->m_lastLoc).m_data[1] = local_58.m_data[1];
    (this->m_lastLoc).m_data[2] = local_58.m_data[2];
  }
  return;
}

Assistant:

void ChChaseCamera::Initialize(const ChVector<>& ptOnChassis,
                               const ChCoordsys<>& driverCoordsys,
                               double chaseDist,
                               double chaseHeight,
                               const ChVector<>& up,
                               const ChVector<>& fwd) {
    m_ptOnChassis = ptOnChassis;
    m_driverCsys = driverCoordsys;
    m_dist = chaseDist;
    m_height = chaseHeight;
    m_angle = 0;

    m_up = up;
    m_fwd = fwd;

    if (m_chassis) {
        ChVector<> localOffset(-m_dist, 0, m_height);
        m_loc = m_chassis->GetFrame_REF_to_abs().TransformPointLocalToParent(m_ptOnChassis + localOffset);
        m_lastLoc = m_loc;
    }
}